

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

string * __thiscall
duckdb::TemporaryFileManager::CreateTemporaryFileName_abi_cxx11_
          (string *__return_storage_ptr__,TemporaryFileManager *this,
          TemporaryFileIdentifier *identifier)

{
  FileSystem *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  unsigned_long in_R8;
  allocator local_81;
  string local_80;
  string local_60 [32];
  string local_40;
  
  this_00 = FileSystem::GetFileSystem(this->db);
  ::std::__cxx11::string::string(local_60,"duckdb_temp_storage_%s-%llu.tmp",&local_81);
  EnumUtil::ToString<duckdb::TemporaryBufferSize>(&local_80,identifier->size);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           optional_idx::GetIndex(&identifier->file_index);
  StringUtil::Format<std::__cxx11::string,unsigned_long>
            (&local_40,(StringUtil *)local_60,&local_80,params,in_R8);
  FileSystem::JoinPath
            ((string *)__return_storage_ptr__,this_00,(string *)&this->temp_directory,
             (string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string(local_60);
  return __return_storage_ptr__;
}

Assistant:

string TemporaryFileManager::CreateTemporaryFileName(const TemporaryFileIdentifier &identifier) const {
	return FileSystem::GetFileSystem(db).JoinPath(
	    temp_directory, StringUtil::Format("duckdb_temp_storage_%s-%llu.tmp", EnumUtil::ToString(identifier.size),
	                                       identifier.file_index.GetIndex()));
}